

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

ostream * wasm::operator<<(ostream *o,Literal *literal)

{
  Type *this;
  array<wasm::Literal,_1UL> *paVar1;
  long *plVar2;
  ulong uVar3;
  IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
  IVar4;
  bool bVar5;
  BasicType BVar6;
  BasicHeapType BVar7;
  int32_t iVar8;
  long lVar9;
  int64_t iVar10;
  ostream *poVar11;
  undefined8 in_RCX;
  array<wasm::Literal,_1UL> *paVar12;
  Literal *other;
  char *pcVar13;
  stringstream *this_00;
  size_t sVar14;
  long lVar15;
  float f;
  double d;
  IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
  IVar16;
  Name NVar17;
  Name name;
  string_view str;
  undefined1 local_258 [8];
  stringstream wtf16;
  ostream local_248 [376];
  SmallVector<wasm::Literal,_1UL> local_d0;
  undefined1 local_98 [8];
  value_type c;
  undefined1 local_60 [8];
  shared_ptr<wasm::GCData> data;
  HeapType heapType;
  
  lVar9 = __tls_get_addr(&PTR_01129bd8);
  plVar2 = (long *)(lVar9 + 0x818);
  lVar9 = *plVar2;
  *plVar2 = lVar9 + 1;
  Colors::orange(o);
  uVar3 = (literal->type).id;
  if ((uVar3 < 2) ||
     (pcVar13 = (char *)CONCAT71((int7)((ulong)in_RCX >> 8),uVar3 < 7),
     (uVar3 & 1) != 0 && uVar3 >= 7)) {
    __assert_fail("literal.type.isSingle()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                  ,0x25e,"std::ostream &wasm::operator<<(std::ostream &, Literal)");
  }
  this = &literal->type;
  if (uVar3 < 7) {
    BVar6 = Type::getBasic(this);
    switch(BVar6) {
    case none:
      std::operator<<(o,"?");
      break;
    case unreachable:
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                         ,0x275);
    case i32:
      iVar8 = Literal::geti32(literal);
      std::ostream::operator<<(o,iVar8);
      break;
    case i64:
      Literal::geti64(literal);
      std::ostream::_M_insert<long>((long)o);
      break;
    case f32:
      f = Literal::getf32(literal);
      Literal::printFloat(o,f);
      break;
    case f64:
      d = Literal::getf64(literal);
      Literal::printDouble(o,d);
      break;
    case v128:
      std::operator<<(o,"i32x4 ");
      _local_258 = (Name)Literal::getv128(literal);
      Literal::printVec128(o,(array<unsigned_char,_16UL> *)local_258);
    }
    goto switchD_00c94523_default;
  }
  if ((uVar3 & 1) != 0) {
    __assert_fail("literal.type.isRef()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                  ,0x278,"std::ostream &wasm::operator<<(std::ostream &, Literal)");
  }
  data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)Type::getHeapType(this);
  bVar5 = HeapType::isShared((HeapType *)
                             &data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
  if (bVar5) {
    std::operator<<(o,"shared ");
  }
  if (data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi <
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x7d) {
    BVar7 = HeapType::getBasic((HeapType *)
                               &data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount,Unshared);
    poVar11 = o;
    switch(BVar7 << 0x1d | BVar7 - ext >> 3) {
    case 0:
      pcVar13 = "externref";
      break;
    case 1:
    case 2:
    case 4:
    case 6:
    case 7:
      handle_unreachable("invalid type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                         ,0x29c);
    case 3:
    case 9:
      Literal::getGCData((Literal *)local_60);
      if (local_60 == (undefined1  [8])0x0) {
        std::operator<<(o,"nullstring");
      }
      else {
        std::operator<<(o,"string(");
        std::__cxx11::stringstream::stringstream((stringstream *)local_258);
        IVar16 = (IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                  )SmallVector<wasm::Literal,_1UL>::end
                             ((SmallVector<wasm::Literal,_1UL> *)((long)local_60 + 8));
        paVar1 = &(((Literals *)((long)local_60 + 8))->super_SmallVector<wasm::Literal,_1UL>).fixed;
        lVar15 = -0x18;
        paVar12 = paVar1;
        for (sVar14 = 0; IVar4.index = sVar14,
            IVar4.parent = (SmallVector<wasm::Literal,_1UL> *)((long)local_60 + 8), IVar16 != IVar4;
            sVar14 = sVar14 + 1) {
          other = (Literal *)
                  ((long)&((((Literals *)((long)local_60 + 8))->
                           super_SmallVector<wasm::Literal,_1UL>).flexible.
                           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl
                           .super__Vector_impl_data._M_start)->field_0 + lVar15);
          if (sVar14 == 0) {
            other = paVar1->_M_elems;
          }
          Literal::Literal((Literal *)local_98,other);
          iVar10 = Literal::getInteger((Literal *)local_98);
          if (0xffff < iVar10) {
            __assert_fail("u < 0x10000",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                          ,0x2a9,"std::ostream &wasm::operator<<(std::ostream &, Literal)");
          }
          std::operator<<(local_248,(char)iVar10);
          std::operator<<(local_248,(char)((ulong)iVar10 >> 8));
          Literal::~Literal((Literal *)local_98);
          lVar15 = lVar15 + 0x18;
        }
        std::__cxx11::stringbuf::str();
        str._M_str = (char *)paVar12;
        str._M_len = (size_t)local_98;
        String::printEscapedJSON
                  ((String *)o,
                   (ostream *)
                   c.field_0.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,str);
        std::__cxx11::string::~string((string *)local_98);
        std::operator<<(o,")");
        std::__cxx11::stringstream::~stringstream((stringstream *)local_258);
      }
      this_00 = (stringstream *)&data;
      goto LAB_00c948e6;
    case 5:
      poVar11 = std::operator<<(o,"i31ref(");
      iVar8 = Literal::geti31(literal,true);
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar8);
LAB_00c946b6:
      pcVar13 = ")";
      break;
    case ext:
      pcVar13 = "exnref";
      break;
    case 10:
      pcVar13 = "nullref";
      break;
    case 0xb:
      pcVar13 = "nullexternref";
      break;
    case 0xc:
      pcVar13 = "nullfuncref";
      break;
    case 0xd:
      pcVar13 = "nullcontref";
      break;
    case 0xe:
      pcVar13 = "nullexnref";
      break;
    default:
      goto switchD_00c94523_default;
    }
    std::operator<<(poVar11,pcVar13);
  }
  else {
    bVar5 = HeapType::isSignature
                      ((HeapType *)
                       &data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
    if (bVar5) {
      poVar11 = std::operator<<(o,"funcref(");
      NVar17 = Literal::getFunc(literal);
      name.super_IString.str._M_len = NVar17.super_IString.str._M_str;
      name.super_IString.str._M_str = pcVar13;
      poVar11 = operator<<((wasm *)poVar11,NVar17.super_IString.str._M_len,name);
      goto LAB_00c946b6;
    }
    bVar5 = Type::isData(this);
    if (!bVar5) {
      __assert_fail("literal.isData()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                    ,0x2b9,"std::ostream &wasm::operator<<(std::ostream &, Literal)");
    }
    Literal::getGCData((Literal *)local_258);
    if (local_258 == (undefined1  [8])0x0) {
      __assert_fail("data",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                    ,699,"std::ostream &wasm::operator<<(std::ostream &, Literal)");
    }
    poVar11 = std::operator<<(o,"[ref ");
    poVar11 = operator<<(poVar11,(HeapType)((HeapType *)local_258)->id);
    poVar11 = std::operator<<(poVar11,' ');
    SmallVector<wasm::Literal,_1UL>::SmallVector
              (&local_d0,(SmallVector<wasm::Literal,_1UL> *)((long)local_258 + 8));
    poVar11 = operator<<(poVar11,(Literals *)&local_d0);
    std::operator<<(poVar11,']');
    SmallVector<wasm::Literal,_1UL>::~SmallVector(&local_d0);
    this_00 = &wtf16;
LAB_00c948e6:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00);
  }
switchD_00c94523_default:
  Colors::normal(o);
  if (lVar9 == 0) {
    *plVar2 = 0;
  }
  return o;
}

Assistant:

std::ostream& operator<<(std::ostream& o, Literal literal) {
  PrintLimiter limiter;

  prepareMinorColor(o);
  assert(literal.type.isSingle());
  if (literal.type.isBasic()) {
    switch (literal.type.getBasic()) {
      case Type::none:
        o << "?";
        break;
      case Type::i32:
        o << literal.geti32();
        break;
      case Type::i64:
        o << literal.geti64();
        break;
      case Type::f32:
        literal.printFloat(o, literal.getf32());
        break;
      case Type::f64:
        literal.printDouble(o, literal.getf64());
        break;
      case Type::v128:
        o << "i32x4 ";
        literal.printVec128(o, literal.getv128());
        break;
      case Type::unreachable:
        WASM_UNREACHABLE("unexpected type");
    }
  } else {
    assert(literal.type.isRef());
    auto heapType = literal.type.getHeapType();
    if (heapType.isShared()) {
      o << "shared ";
    }
    if (heapType.isBasic()) {
      switch (heapType.getBasic(Unshared)) {
        case HeapType::i31:
          o << "i31ref(" << literal.geti31() << ")";
          break;
        case HeapType::none:
          o << "nullref";
          break;
        case HeapType::noext:
          o << "nullexternref";
          break;
        case HeapType::nofunc:
          o << "nullfuncref";
          break;
        case HeapType::noexn:
          o << "nullexnref";
          break;
        case HeapType::nocont:
          o << "nullcontref";
          break;
        case HeapType::ext:
          o << "externref";
          break;
        case HeapType::exn:
          o << "exnref";
          break;
        case HeapType::eq:
        case HeapType::func:
        case HeapType::cont:
        case HeapType::struct_:
        case HeapType::array:
          WASM_UNREACHABLE("invalid type");
        case HeapType::any:
          // Anyref literals contain strings.
        case HeapType::string: {
          auto data = literal.getGCData();
          if (!data) {
            o << "nullstring";
          } else {
            o << "string(";
            // Convert WTF-16 literals to WTF-16 string.
            std::stringstream wtf16;
            for (auto c : data->values) {
              auto u = c.getInteger();
              assert(u < 0x10000);
              wtf16 << uint8_t(u & 0xFF);
              wtf16 << uint8_t(u >> 8);
            }
            // Escape to ensure we have valid unicode output and to make
            // unprintable characters visible.
            // TODO: Use wtf16.view() once we have C++20.
            String::printEscapedJSON(o, wtf16.str());
            o << ")";
          }
          break;
        }
      }
    } else if (heapType.isSignature()) {
      o << "funcref(" << literal.getFunc() << ")";
    } else {
      assert(literal.isData());
      auto data = literal.getGCData();
      assert(data);
      o << "[ref " << data->type << ' ' << data->values << ']';
    }
  }
  restoreNormalColor(o);
  return o;
}